

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_FourClosedTriplets_Test::
~TEST_DoublingFactorCounterTest_FourClosedTriplets_Test
          (TEST_DoublingFactorCounterTest_FourClosedTriplets_Test *this)

{
  TEST_DoublingFactorCounterTest_FourClosedTriplets_Test *mem;
  TEST_DoublingFactorCounterTest_FourClosedTriplets_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_FourClosedTriplets_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, FourClosedTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::OneOfCharacters, false);
	addTriplet(Tile::TwoOfCircles, false);
	addQuad(Tile::ThreeOfBamboos, false);
	addTriplet(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::FourClosedTriplets));
	CHECK_EQUAL(100, r.doubling_factor);
}